

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3MaterializeView
               (Parse *pParse,Table *pView,Expr *pWhere,ExprList *pOrderBy,Expr *pLimit,int iCur)

{
  sqlite3 *db;
  Schema *pSVar1;
  Expr *pWhere_00;
  SrcList *pSrc;
  char *pcVar2;
  Select *p;
  Schema **ppSVar3;
  long lVar4;
  SelectDest dest;
  
  db = pParse->db;
  if (pView->pSchema == (Schema *)0x0) {
    lVar4 = -0x8000;
  }
  else {
    lVar4 = -0x100000000;
    ppSVar3 = &db->aDb->pSchema;
    do {
      lVar4 = lVar4 + 0x100000000;
      pSVar1 = *ppSVar3;
      ppSVar3 = ppSVar3 + 4;
    } while (pSVar1 != pView->pSchema);
    lVar4 = lVar4 >> 0x20;
  }
  if (pWhere == (Expr *)0x0) {
    pWhere_00 = (Expr *)0x0;
  }
  else {
    pWhere_00 = exprDup(db,pWhere,0,(u8 **)0x0);
  }
  pSrc = sqlite3SrcListAppend(pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
  if (pSrc == (SrcList *)0x0) {
    pSrc = (SrcList *)0x0;
  }
  else {
    pcVar2 = sqlite3DbStrDup(db,pView->zName);
    pSrc->a[0].zName = pcVar2;
    pcVar2 = sqlite3DbStrDup(db,db->aDb[lVar4].zDbSName);
    pSrc->a[0].zDatabase = pcVar2;
  }
  p = sqlite3SelectNew(pParse,(ExprList *)0x0,pSrc,pWhere_00,(ExprList *)0x0,(Expr *)0x0,
                       (ExprList *)0x0,0x20000,(Expr *)0x0);
  dest.eDest = '\f';
  dest.iSDParm2 = 0;
  dest.zAffSdst = (char *)0x0;
  dest.iSdst = 0;
  dest.nSdst = 0;
  dest.iSDParm = (int)pOrderBy;
  sqlite3Select(pParse,p,&dest);
  if (p != (Select *)0x0) {
    clearSelect(db,p,1);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MaterializeView(
  Parse *pParse,       /* Parsing context */
  Table *pView,        /* View definition */
  Expr *pWhere,        /* Optional WHERE clause to be added */
  ExprList *pOrderBy,  /* Optional ORDER BY clause */
  Expr *pLimit,        /* Optional LIMIT clause */
  int iCur             /* Cursor number for ephemeral table */
){
  SelectDest dest;
  Select *pSel;
  SrcList *pFrom;
  sqlite3 *db = pParse->db;
  int iDb = sqlite3SchemaToIndex(db, pView->pSchema);
  pWhere = sqlite3ExprDup(db, pWhere, 0);
  pFrom = sqlite3SrcListAppend(pParse, 0, 0, 0);
  if( pFrom ){
    assert( pFrom->nSrc==1 );
    pFrom->a[0].zName = sqlite3DbStrDup(db, pView->zName);
    pFrom->a[0].zDatabase = sqlite3DbStrDup(db, db->aDb[iDb].zDbSName);
    assert( pFrom->a[0].fg.isUsing==0 );
    assert( pFrom->a[0].u3.pOn==0 );
  }
  pSel = sqlite3SelectNew(pParse, 0, pFrom, pWhere, 0, 0, pOrderBy,
                          SF_IncludeHidden, pLimit);
  sqlite3SelectDestInit(&dest, SRT_EphemTab, iCur);
  sqlite3Select(pParse, pSel, &dest);
  sqlite3SelectDelete(db, pSel);
}